

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volid_test.cpp
# Opt level: O0

void __thiscall default_volid_lic_file::test_method(default_volid_lic_file *this)

{
  LicenseLocation licenseLocation_00;
  unit_test_log_t *puVar1;
  bool bVar2;
  basic_wrap_stringstream<char> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  ostream *poVar4;
  lazy_ostream *plVar5;
  undefined1 local_e41;
  basic_cstring<const_char> local_e40;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e30;
  basic_cstring<const_char> local_e08;
  basic_cstring<const_char> local_df8;
  undefined1 local_de1;
  basic_cstring<const_char> local_de0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_dd0;
  basic_cstring<const_char> local_da8;
  basic_cstring<const_char> local_d98;
  undefined4 local_d84;
  basic_cstring<const_char> local_d80;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d70;
  basic_cstring<const_char> local_d48;
  basic_cstring<const_char> local_d38;
  undefined8 local_d28;
  char *pcStack_d20;
  undefined8 local_d18;
  EVENT_TYPE local_d0c;
  undefined8 uStack_d08;
  EVENT_TYPE result;
  LicenseLocation licenseLocation;
  LicenseInfo license;
  allocator local_269;
  value_type local_268;
  undefined1 local_248 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraArgs;
  undefined1 local_228 [4];
  FUNCTION_RETURN generate_ok;
  basic_cstring<const_char> local_90;
  basic_cstring<const_char> local_80;
  IDENTIFICATION_STRATEGY local_6c;
  char local_68 [4];
  IDENTIFICATION_STRATEGY strategy;
  PcSignature identifier_out;
  allocator local_31;
  undefined1 local_30 [8];
  string licLocation;
  default_volid_lic_file *this_local;
  
  licLocation.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"Testing/Temporary/volid_license.lic",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6c = ETHERNET;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
             ,0x75);
  memset((basic_wrap_stringstream<char> *)local_228,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_228);
  pbVar3 = boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_228);
  pbVar3 = boost::operator<<(pbVar3,(char (*) [16])"Before generate");
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar3);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_90,s);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_80,0x19,&local_90);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_228);
  extraArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       generate_user_pc_signature(local_68,local_6c);
  if (extraArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != FUNC_RET_OK) {
    __assert_fail("generate_ok == FUNCTION_RETURN::FUNC_RET_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                  ,0x1c,"void default_volid_lic_file::test_method()");
  }
  poVar4 = std::operator<<((ostream *)std::cout,"Identifier:");
  poVar4 = std::operator<<(poVar4,local_68);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"-s",&local_269);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_248,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&license.license_version,local_68,(allocator *)&license.field_0xa53);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_248,(value_type *)&license.license_version);
  std::__cxx11::string::~string((string *)&license.license_version);
  std::allocator<char>::~allocator((allocator<char> *)&license.field_0xa53);
  generate_license((string *)local_30,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_248);
  licenseLocation.environmentVariableName._0_1_ = 0;
  local_d28 = std::__cxx11::string::c_str();
  licenseLocation.licenseFileLocation = "";
  local_d18 = CONCAT71(licenseLocation.environmentVariableName._1_7_,
                       licenseLocation.environmentVariableName._0_1_);
  pcStack_d20 = "";
  licenseLocation_00.environmentVariableName = "";
  licenseLocation_00.licenseFileLocation = (char *)local_d28;
  licenseLocation_00._16_8_ = local_d18;
  uStack_d08 = local_d28;
  local_d0c = acquire_license("TEST",licenseLocation_00,(LicenseInfo *)&licenseLocation.field_0x14);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d48);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_d38,0x29,&local_d48);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d70,plVar5,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
               ,0x75);
    local_d84 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,EVENT_TYPE,EVENT_TYPE>
              (&local_d70,&local_d80,0x29,1,2,&local_d0c,"result",&local_d84,"LICENSE_OK");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d70);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_da8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_d98,0x2a,&local_da8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_dd0,plVar5,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_de0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
               ,0x75);
    local_de1 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_dd0,&local_de0,0x2a,1,2,license.expiry_date + 8,"license.has_expiry",
               &local_de1,"false");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_dd0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_df8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e08);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_df8,0x2b,&local_e08);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e30,plVar5,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
               ,0x75);
    local_e41 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_e30,&local_e40,0x2b,1,2,license.expiry_date + 9,"license.linked_to_pc",
               &local_e41,"true");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e30);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_248);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( default_volid_lic_file ) {
	const string licLocation(PROJECT_TEST_TEMP_DIR "/volid_license.lic");
	PcSignature identifier_out;

	IDENTIFICATION_STRATEGY strategy = IDENTIFICATION_STRATEGY::ETHERNET;
	BOOST_TEST_CHECKPOINT("Before generate");
	FUNCTION_RETURN generate_ok = generate_user_pc_signature(identifier_out,
			strategy);
	BOOST_ASSERT(generate_ok == FUNCTION_RETURN::FUNC_RET_OK);
	cout << "Identifier:" << identifier_out << endl;
	vector<string> extraArgs;
    extraArgs.push_back("-s");
    extraArgs.push_back(identifier_out);
	generate_license(licLocation, extraArgs);

	LicenseInfo license;
	LicenseLocation licenseLocation;
	licenseLocation.openFileNearModule = false;
	licenseLocation.licenseFileLocation = licLocation.c_str();
	licenseLocation.environmentVariableName = "";
	EVENT_TYPE result = acquire_license("TEST", licenseLocation, &license);
	BOOST_CHECK_EQUAL(result, LICENSE_OK);
	BOOST_CHECK_EQUAL(license.has_expiry, false);
	BOOST_CHECK_EQUAL(license.linked_to_pc, true);
}